

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QMdiSubWindow::showShaded(QMdiSubWindow *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindowPrivate *this_00;
  Data *pDVar5;
  QWidgetData *pQVar6;
  QObject *pQVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  bool bVar11;
  QWidget *pQVar12;
  Data *pDVar13;
  QSize QVar14;
  short sVar15;
  
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    return;
  }
  if ((this_00->isShadeRequestFromMinimizeMode == false) && (this_00->isShadeMode != false)) {
    return;
  }
  this_00->isMaximizeMode = false;
  pQVar12 = QApplication::focusWidget();
  if (((pQVar12 != (QWidget *)0x0) &&
      (((pDVar5 = (this_00->restoreFocusWidget).wp.d, pDVar5 == (Data *)0x0 ||
        (*(int *)(pDVar5 + 4) == 0)) || ((this_00->restoreFocusWidget).wp.value == (QObject *)0x0)))
      ) && (bVar11 = QWidget::isAncestorOf
                               (*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8,pQVar12),
           bVar11)) {
    pDVar13 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar12->super_QObject);
    pDVar5 = (this_00->restoreFocusWidget).wp.d;
    (this_00->restoreFocusWidget).wp.d = pDVar13;
    (this_00->restoreFocusWidget).wp.value = &pQVar12->super_QObject;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar5 = *(int *)pDVar5 + -1;
      UNLOCK();
      if (*(int *)pDVar5 == 0) {
        operator_delete(pDVar5);
      }
    }
  }
  if (this_00->isShadeRequestFromMinimizeMode == false) {
    this_00->isShadeMode = true;
    QMdiSubWindowPrivate::ensureWindowState(this_00,WindowMinimized);
  }
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(this_00);
  bVar11 = QWidget::hasFocus(&this->super_QWidget);
  if (!bVar11) {
    pQVar12 = QApplication::focusWidget();
    bVar11 = QWidget::isAncestorOf(&this->super_QWidget,pQVar12);
    if (!bVar11) goto LAB_0044d0d8;
  }
  QMdiSubWindowPrivate::ensureWindowState(this_00,WindowActive);
LAB_0044d0d8:
  QMdiSubWindowPrivate::setSizeGripVisible(this_00,false);
  if ((((this_00->restoreSize).wd.m_i < 0) || ((this_00->restoreSize).ht.m_i < 0)) ||
     (this_00->isShadeMode == true)) {
    pQVar6 = (this->super_QWidget).data;
    RVar8.m_i = (pQVar6->crect).y1.m_i;
    RVar9.m_i = (pQVar6->crect).x2.m_i;
    RVar10.m_i = (pQVar6->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar6->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar8.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar9.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar10.m_i;
    uVar1 = (this_00->oldGeometry).x2;
    uVar3 = (this_00->oldGeometry).y2;
    uVar2 = (this_00->oldGeometry).x1;
    uVar4 = (this_00->oldGeometry).y1;
    QVar14.wd.m_i = (uVar1 - uVar2) + 1;
    QVar14.ht.m_i = (uVar3 - uVar4) + 1;
    this_00->restoreSize = QVar14;
  }
  sVar15 = (short)((this->super_QWidget).data)->widget_attributes;
  if (sVar15 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,0);
  }
  QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
  QVar14 = QWidget::minimumSize(&this->super_QWidget);
  if (QVar14 != (QSize)0x0) {
    QVar14 = QWidget::minimumSize(&this->super_QWidget);
    this_00->userMinimumSize = QVar14;
    QWidget::setMinimumSize
              (&this->super_QWidget,(this_00->internalMinimumSize).wd.m_i,
               (this_00->internalMinimumSize).ht.m_i);
  }
  QWidget::resize(&this->super_QWidget,&this_00->internalMinimumSize);
  pDVar5 = (this_00->baseWidget).wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     ((pQVar12 = (QWidget *)(this_00->baseWidget).wp.value, pQVar12 != (QWidget *)0x0 &&
      (((pQVar12->data->widget_attributes & 0x10000) == 0 &&
       (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x800) == 0)))))) {
    QWidget::hide(pQVar12);
    this_00->isWidgetHiddenByUs = true;
  }
  if (sVar15 < 0) {
    (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
  }
  QMdiSubWindowPrivate::setFocusWidget(this_00);
  this_00->resizeEnabled = false;
  this_00->moveEnabled = true;
  QMdiSubWindowPrivate::updateDirtyRegions(this_00);
  QMdiSubWindowPrivate::updateMask(this_00);
  pDVar5 = this_00->actions[3].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this_00->actions[3].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this_00->actions[2].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this_00->actions[2].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this_00->actions[4].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this_00->actions[4].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this_00->actions[0].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this_00->actions[0].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
  }
  pDVar5 = this_00->actions[1].wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (pQVar7 = this_00->actions[1].wp.value, pQVar7 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar7,0));
    return;
  }
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }